

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationY.hpp
# Opt level: O1

RotationY<double> *
qclab::qgates::operator/
          (RotationY<double> *__return_storage_ptr__,RotationY<double> *lhs,RotationY<double> *rhs)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  
  iVar6 = (lhs->super_QRotationGate1<double>).super_QGate1<double>.qubit_;
  iVar5 = (*(rhs->super_QRotationGate1<double>).super_QGate1<double>.super_QObject<double>.
            _vptr_QObject[3])(rhs);
  if (iVar6 != iVar5) {
    __assert_fail("lhs.qubit() == rhs.qubit()",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/RotationY.hpp"
                  ,0xb9,"RotationY<T> qclab::qgates::operator/(RotationY<T>, const RotationY<T> &)")
    ;
  }
  iVar6 = (*(lhs->super_QRotationGate1<double>).super_QGate1<double>.super_QObject<double>.
            _vptr_QObject[3])(lhs);
  iVar5 = (*(rhs->super_QRotationGate1<double>).super_QGate1<double>.super_QObject<double>.
            _vptr_QObject[3])(rhs);
  if (iVar6 == iVar5) {
    dVar1 = (lhs->super_QRotationGate1<double>).rotation_.angle_.cos_;
    dVar2 = (lhs->super_QRotationGate1<double>).rotation_.angle_.sin_;
    dVar3 = (rhs->super_QRotationGate1<double>).rotation_.angle_.cos_;
    dVar4 = (rhs->super_QRotationGate1<double>).rotation_.angle_.sin_;
    (lhs->super_QRotationGate1<double>).rotation_.angle_.cos_ = dVar1 * dVar3 + dVar2 * dVar4;
    (lhs->super_QRotationGate1<double>).rotation_.angle_.sin_ = dVar2 * dVar3 - dVar4 * dVar1;
    (__return_storage_ptr__->super_QRotationGate1<double>).super_QGate1<double>.
    super_QObject<double>._vptr_QObject = (_func_int **)&PTR_nbQubits_00521250;
    (__return_storage_ptr__->super_QRotationGate1<double>).super_QGate1<double>.qubit_ =
         (lhs->super_QRotationGate1<double>).super_QGate1<double>.qubit_;
    (__return_storage_ptr__->super_QRotationGate1<double>).super_QGate1<double>.field_0xc =
         (lhs->super_QRotationGate1<double>).super_QGate1<double>.field_0xc;
    (__return_storage_ptr__->super_QRotationGate1<double>).super_QGate1<double>.
    super_QObject<double>._vptr_QObject = (_func_int **)&PTR_nbQubits_005213b0;
    dVar1 = (lhs->super_QRotationGate1<double>).rotation_.angle_.sin_;
    (__return_storage_ptr__->super_QRotationGate1<double>).rotation_.angle_.cos_ =
         (lhs->super_QRotationGate1<double>).rotation_.angle_.cos_;
    (__return_storage_ptr__->super_QRotationGate1<double>).rotation_.angle_.sin_ = dVar1;
    (__return_storage_ptr__->super_QRotationGate1<double>).super_QGate1<double>.
    super_QObject<double>._vptr_QObject = (_func_int **)&PTR_nbQubits_005212d8;
    return __return_storage_ptr__;
  }
  __assert_fail("this->qubit() == rhs.qubit()",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/RotationY.hpp"
                ,0xa9,
                "RotationY<T> &qclab::qgates::RotationY<double>::operator/=(const RotationY<T> &) [T = double]"
               );
}

Assistant:

RotationY< T > operator/( RotationY< T > lhs ,
                                         const RotationY< T >& rhs ) {
          assert( lhs.qubit() == rhs.qubit() ) ;
          lhs /= rhs ;
          return lhs ;
        }